

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

QSize __thiscall QWidgetItem::maximumSize(QWidgetItem *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QWidgetPrivate *i;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_0000000c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QSize *in_stack_ffffffffffffffc0;
  QWidget *in_stack_ffffffffffffffc8;
  QWidgetPrivate *priv;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  priv = in_RDI;
  uVar3 = (**(code **)((long)*(QSize *)in_RDI + 0x40))();
  if ((uVar3 & 1) == 0) {
    bVar2 = QWidget::testAttribute
                      (in_stack_ffffffffffffffc8,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (bVar2) {
      local_10 = qSmartMaxSize((QWidgetItem *)in_stack_ffffffffffffffc8,
                               (Alignment)in_stack_0000000c.i);
    }
    else {
      i = QWidget::d_func((QWidget *)0x346526);
      qSmartMaxSize((QWidgetItem *)i,(Alignment)in_stack_0000000c.i);
      local_10 = toLayoutItemSize(priv,(QSize *)in_RDI);
    }
  }
  else {
    QSize::QSize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QWidgetItem::maximumSize() const
{
    if (isEmpty()) {
        return QSize(0, 0);
    } else {
        return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
               ? toLayoutItemSize(wid->d_func(), qSmartMaxSize(this, align))
               : qSmartMaxSize(this, align);
    }
}